

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_image(nk_context *ctx,nk_image img)

{
  nk_rect r;
  nk_widget_layout_states nVar1;
  nk_command_buffer *in_RDI;
  nk_color unaff_retaddr;
  nk_rect bounds;
  nk_window *win;
  nk_image *img_00;
  
  if (((in_RDI != (nk_command_buffer *)0x0) && (*(long *)&in_RDI[0x103].use_clipping != 0)) &&
     (*(long *)(*(long *)&in_RDI[0x103].use_clipping + 0xa8) != 0)) {
    img_00 = *(nk_image **)&in_RDI[0x103].use_clipping;
    nVar1 = nk_widget((nk_rect *)win,(nk_context *)bounds._8_8_);
    if (nVar1 != NK_WIDGET_INVALID) {
      r._8_8_ = bounds._8_8_;
      r._0_8_ = bounds._0_8_;
      nk_draw_image(in_RDI,r,img_00,unaff_retaddr);
    }
  }
  return;
}

Assistant:

NK_API void
nk_image(struct nk_context *ctx, struct nk_image img)
{
struct nk_window *win;
struct nk_rect bounds;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return;

win = ctx->current;
if (!nk_widget(&bounds, ctx)) return;
nk_draw_image(&win->buffer, bounds, &img, nk_white);
}